

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopwave.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  char name [32];
  undefined1 auStack_38 [32];
  
  iVar1 = SDL_Init(0x10);
  if (iVar1 < 0) {
    main_cold_3();
    return 1;
  }
  if (argc < 2) {
    pcVar4 = "sample.wav";
  }
  else {
    pcVar4 = argv[1];
  }
  uVar2 = SDL_RWFromFile(pcVar4,"rb");
  lVar3 = SDL_LoadWAV_RW(uVar2,1,&wave,0x1040d8,0x1040e0);
  if (lVar3 == 0) {
    main_cold_2();
  }
  else {
    wave.spec.callback = fillerup;
    signal(1,poked);
    signal(2,poked);
    signal(3,poked);
    signal(0xf,poked);
    iVar1 = SDL_OpenAudio(&wave,0);
    if (-1 < iVar1) {
      SDL_PauseAudio(0);
      uVar2 = SDL_AudioDriverName(auStack_38,0x20);
      printf("Using audio driver: %s\n",uVar2);
      if (done == '\0') {
        do {
          iVar1 = SDL_GetAudioStatus();
          if (iVar1 != 1) break;
          SDL_Delay(1000);
        } while (done != '\x01');
      }
      SDL_CloseAudio();
      SDL_FreeWAV(wave.sound);
      SDL_Quit();
      return 0;
    }
  }
  main_cold_1();
  return extraout_EAX;
}

Assistant:

int main(int argc, char *argv[])
{
	char name[32];
	const char *file;

	/* Load the SDL library */
	if ( SDL_Init(SDL_INIT_AUDIO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}
	file = (argc < 2) ? "sample.wav" : argv[1];
	/* Load the wave file into memory */
	if ( SDL_LoadWAV(file, &wave.spec, &wave.sound, &wave.soundlen) == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s\n", file, SDL_GetError());
		quit(1);
	}

	wave.spec.callback = fillerup;
#if HAVE_SIGNAL_H
	/* Set the signals */
#ifdef SIGHUP
	signal(SIGHUP, poked);
#endif
	signal(SIGINT, poked);
#ifdef SIGQUIT
	signal(SIGQUIT, poked);
#endif
	signal(SIGTERM, poked);
#endif /* HAVE_SIGNAL_H */

	/* Initialize fillerup() variables */
	if ( SDL_OpenAudio(&wave.spec, NULL) < 0 ) {
		fprintf(stderr, "Couldn't open audio: %s\n", SDL_GetError());
		SDL_FreeWAV(wave.sound);
		quit(2);
	}
	SDL_PauseAudio(0);

	/* Let the audio run */
	printf("Using audio driver: %s\n", SDL_AudioDriverName(name, 32));
	while ( ! done && (SDL_GetAudioStatus() == SDL_AUDIO_PLAYING) )
		SDL_Delay(1000);

	/* Clean up on signal */
	SDL_CloseAudio();
	SDL_FreeWAV(wave.sound);
	SDL_Quit();
	return(0);
}